

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O3

void duckdb::SchemaSetting::SetLocal(ClientContext *context,Value *input)

{
  ClientData *pCVar1;
  pointer this;
  string parameter;
  string local_68;
  CatalogSearchEntry local_48;
  
  Value::ToString_abi_cxx11_(&local_68,input);
  pCVar1 = ClientData::Get(context);
  this = unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
         ::operator->(&pCVar1->catalog_search_path);
  CatalogSearchEntry::Parse(&local_48,&local_68);
  CatalogSearchPath::Set(this,&local_48,SET_SCHEMA);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.schema._M_dataplus._M_p != &local_48.schema.field_2) {
    operator_delete(local_48.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.catalog._M_dataplus._M_p != &local_48.catalog.field_2) {
    operator_delete(local_48.catalog._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

void SchemaSetting::SetLocal(ClientContext &context, const Value &input) {
	auto parameter = input.ToString();
	auto &client_data = ClientData::Get(context);
	client_data.catalog_search_path->Set(CatalogSearchEntry::Parse(parameter), CatalogSetPathType::SET_SCHEMA);
}